

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O3

vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> * __thiscall
DistanceGraph::fw_neighbours_by_distance
          (vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
           *__return_storage_ptr__,DistanceGraph *this,sgNodeID_t n,int min_links)

{
  pointer *pppVar1;
  pointer pvVar2;
  pointer pLVar3;
  iterator __position;
  _Base_ptr p_Var4;
  iterator __position_00;
  pointer ppVar5;
  pointer ppVar6;
  long lVar7;
  vector<int,std::allocator<int>> *this_00;
  ulong uVar8;
  _Base_ptr p_Var9;
  ulong uVar10;
  _Base_ptr p_Var11;
  int32_t *__args;
  pointer pLVar12;
  map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  fndists;
  pair<int,_long> local_70;
  _Rb_tree<long,_std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_60;
  
  if (0 < min_links) {
    uVar8 = n;
    if (n < 1) {
      uVar8 = -n;
    }
    pvVar2 = (this->links).
             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar8 < (ulong)(((long)(this->links).
                               super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
                       -0x5555555555555555)) {
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pLVar12 = pvVar2[uVar8].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data._M_start;
      pLVar3 = *(pointer *)
                ((long)&pvVar2[uVar8].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                        super__Vector_impl_data + 8);
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (pLVar12 != pLVar3) {
        __args = &pLVar12->dist;
        do {
          if (((Link *)(__args + -4))->source == -n) {
            this_00 = (vector<int,std::allocator<int>> *)
                      std::
                      map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[]((map<long,_std::vector<int,_std::allocator<int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)&local_60,(key_type *)(__args + -2));
            __position._M_current = *(int **)(this_00 + 8);
            if (__position._M_current == *(int **)(this_00 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_00,__position,__args);
            }
            else {
              *__position._M_current = *__args;
              *(int **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          pLVar12 = (pointer)(__args + 6);
          __args = __args + 10;
        } while (pLVar12 != pLVar3);
        if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_60._M_impl.super__Rb_tree_header) {
          p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            p_Var11 = p_Var9[1]._M_parent;
            p_Var4 = p_Var9[1]._M_left;
            uVar10 = (long)p_Var4 - (long)p_Var11;
            uVar8 = (long)uVar10 >> 2;
            if ((uint)min_links <= uVar8) {
              if (p_Var11 != p_Var4) {
                lVar7 = 0x3f;
                if (uVar8 != 0) {
                  for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                          (p_Var11,p_Var4,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
                std::
                __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (p_Var11,p_Var4);
                p_Var11 = p_Var9[1]._M_parent;
                uVar10 = (long)p_Var9[1]._M_left - (long)p_Var11;
                uVar8 = (long)uVar10 >> 2;
              }
              if ((uVar10 & 4) == 0) {
                local_70.first =
                     (*(int *)((long)&p_Var11->_M_color + uVar8 * 2) +
                     *(int *)((long)p_Var11 + uVar8 * 2 + -4)) / 2;
                local_70.second = *(long *)(p_Var9 + 1);
                __position_00._M_current =
                     (__return_storage_ptr__->
                     super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (__position_00._M_current ==
                    (__return_storage_ptr__->
                    super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
                  _M_realloc_insert<std::pair<int,long>>
                            ((vector<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)
                             __return_storage_ptr__,__position_00,&local_70);
                }
                else {
                  *(ulong *)__position_00._M_current = CONCAT44(local_70._4_4_,local_70.first);
                  (__position_00._M_current)->second = local_70.second;
                  pppVar1 = &(__return_storage_ptr__->
                             super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *pppVar1 = *pppVar1 + 1;
                }
              }
              else {
                std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>::
                emplace_back<int&,long_const&>
                          ((vector<std::pair<int,long>,std::allocator<std::pair<int,long>>> *)
                           __return_storage_ptr__,
                           (int *)((long)&p_Var11->_M_color + (uVar8 & 0xfffffffffffffffe) * 2),
                           (long *)(p_Var9 + 1));
              }
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != &local_60._M_impl.super__Rb_tree_header);
        }
      }
      ppVar5 = (__return_storage_ptr__->
               super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      ppVar6 = (__return_storage_ptr__->
               super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar5 != ppVar6) {
        uVar8 = (long)ppVar6 - (long)ppVar5 >> 4;
        lVar7 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,long>*,std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (ppVar5,ppVar6,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,long>*,std::vector<std::pair<int,long>,std::allocator<std::pair<int,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (ppVar5,ppVar6);
      }
      std::
      _Rb_tree<long,_std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_60);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int,sgNodeID_t>> DistanceGraph::fw_neighbours_by_distance(sgNodeID_t n, int min_links) const {
    if (min_links<1 or llabs(n)>=links.size()) return {};
    std::map<sgNodeID_t,std::vector<int>> fndists;//neighbour and all distances to it
    std::vector<std::pair<int,sgNodeID_t>> fnd; //median distance and neighbours if with min_links
    //ndists[dest] -> [dist1, dist2, dist3...]
    for (auto &l:links[llabs(n)]){
        if (l.source==-n){
            fndists[l.dest].emplace_back(l.dist);
        }
    }
    //fnd <- [(median2, n1),(median2,n2)...]
    for (auto &fn:fndists){
        if (fn.second.size()>=min_links){
            std::sort(fn.second.begin(),fn.second.end());
            if (fn.second.size()%2==0) fnd.emplace_back(std::make_pair((fn.second[fn.second.size()/2-1]+fn.second[fn.second.size()/2])/2,fn.first));
            else fnd.emplace_back(fn.second[fn.second.size()/2],fn.first);
        }
    }
    std::sort(fnd.begin(),fnd.end());
    return fnd;
}